

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

char * ImAtoi<int>(char *src,int *output)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)(*src == '-');
  iVar2 = 0;
  for (pcVar1 = src + (src[uVar3] == '+') + uVar3; (byte)(*pcVar1 - 0x30U) < 10; pcVar1 = pcVar1 + 1
      ) {
    iVar2 = (uint)(byte)(*pcVar1 - 0x30U) + iVar2 * 10;
  }
  iVar4 = -iVar2;
  if (*src != '-') {
    iVar4 = iVar2;
  }
  *output = iVar4;
  return pcVar1;
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}